

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::verifySampleBuffers
          (SampleMaskUniqueSetCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  pointer pSVar1;
  uint uVar2;
  pointer pSVar3;
  undefined8 uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          m_numTargetSamples;
  uVar5 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      pSVar3 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)pSVar3 + lVar7 + -8);
      pSVar1 = (this->m_iterationSampleBuffers).
               super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
               super__Vector_impl_data._M_start +
               ((int)uVar5 *
                (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.m_iteration + (int)lVar6);
      pSVar1->m_width = (int)uVar4;
      pSVar1->m_height = (int)((ulong)uVar4 >> 0x20);
      de::ArrayBuffer<unsigned_int,_4UL,_4UL>::operator=
                (&pSVar1->m_pixels,
                 (ArrayBuffer<unsigned_int,_4UL,_4UL> *)((long)&pSVar3->m_width + lVar7));
      lVar6 = lVar6 + 1;
      uVar5 = (ulong)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                     super_MultisampleRenderCase.m_numTargetSamples;
      lVar7 = lVar7 + 0x18;
    } while (lVar6 < (long)uVar5);
  }
  return true;
}

Assistant:

bool SampleMaskUniqueSetCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	// we need results from all passes to do verification. Store results and verify later (at postTest).

	DE_ASSERT(m_numTargetSamples == (int)resultBuffers.size());
	for (int ndx = 0; ndx < m_numTargetSamples; ++ndx)
		m_iterationSampleBuffers[m_iteration * m_numTargetSamples + ndx] = resultBuffers[ndx];

	return true;
}